

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_FONT *font;
  undefined8 extraout_RAX;
  char *format;
  Theme theme;
  Prog prog;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    al_init_image_addon();
    al_set_new_display_flags(0x40);
    display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Unable to create display\n";
    }
    else {
      font = (ALLEGRO_FONT *)al_load_font("data/fixed_font.tga",0,0);
      if (font == (ALLEGRO_FONT *)0x0) {
        format = "Failed to load data/fixed_font.tga\n";
      }
      else {
        allegro = (ALLEGRO_BITMAP *)al_load_bitmap("data/allegro.pcx");
        if (allegro == (ALLEGRO_BITMAP *)0x0) {
          format = "Failed to load data/allegro.pcx\n";
        }
        else {
          mysha = (ALLEGRO_BITMAP *)al_load_bitmap("data/mysha256x256.png");
          if (mysha != (ALLEGRO_BITMAP *)0x0) {
            target = (ALLEGRO_BITMAP *)al_create_bitmap(0x140,200);
            al_add_new_bitmap_flag(1);
            allegro_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(allegro);
            mysha_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(mysha);
            target_bmp = (ALLEGRO_BITMAP *)al_clone_bitmap(target);
            Theme::Theme(&theme,font);
            Prog::Prog(&prog,&theme,display);
            Prog::run(&prog);
            Prog::~Prog(&prog);
            al_destroy_bitmap(allegro);
            al_destroy_bitmap(allegro_bmp);
            al_destroy_bitmap(mysha);
            al_destroy_bitmap(mysha_bmp);
            al_destroy_bitmap(target);
            al_destroy_bitmap(target_bmp);
            al_destroy_font(font);
            return 0;
          }
          format = "Failed to load data/mysha256x256.png\n";
          mysha = (ALLEGRO_BITMAP *)0x0;
        }
      }
    }
  }
  abort_example(format);
  Prog::~Prog(&prog);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   font = al_load_font("data/fixed_font.tga", 0, 0);
   if (!font) {
      abort_example("Failed to load data/fixed_font.tga\n");
   }
   allegro = al_load_bitmap("data/allegro.pcx");
   if (!allegro) {
      abort_example("Failed to load data/allegro.pcx\n");
   }
   mysha = al_load_bitmap("data/mysha256x256.png");
   if (!mysha) {
      abort_example("Failed to load data/mysha256x256.png\n");
   }
   
   target = al_create_bitmap(320, 200);

   al_add_new_bitmap_flag(ALLEGRO_MEMORY_BITMAP);
   allegro_bmp = al_clone_bitmap(allegro);
   mysha_bmp = al_clone_bitmap(mysha);
   target_bmp = al_clone_bitmap(target);

   /* Don't remove these braces. */
   {
      Theme theme(font);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_bitmap(allegro);
   al_destroy_bitmap(allegro_bmp);
   al_destroy_bitmap(mysha);
   al_destroy_bitmap(mysha_bmp);
   al_destroy_bitmap(target);
   al_destroy_bitmap(target_bmp);

   al_destroy_font(font);

   return 0;
}